

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall Camera::_castShadowRays(Camera *this,Intersection *i,World *world)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer ppPVar3;
  PointLight *pPVar4;
  SceneObject *pSVar5;
  double dVar6;
  ColorRGB c;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ColorRGB CVar15;
  Ray shadowRay;
  ColorRGB local_e0;
  double local_d0;
  float local_c4;
  ColorRGB *local_c0;
  ulong local_b8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_a4;
  ulong local_98;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_90;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 uStack_65;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_60;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 uStack_35;
  
  ppSVar1 = (world->sceneObjects->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  ppSVar2 = (world->sceneObjects->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(world->pointLights->
                        super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(world->pointLights->
                       super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  Ray::Ray((Ray *)&local_90.field_0);
  ColorRGB::ColorRGB(&local_e0);
  local_b8 = uVar9;
  if (0 < (int)uVar9) {
    local_98 = (ulong)((long)ppSVar1 - (long)ppSVar2) >> 3;
    local_c0 = &i->color;
    local_b8 = uVar9 & 0x7fffffff;
    uVar9 = local_98 & 0x7fffffff;
    uVar8 = 0;
    do {
      ppPVar3 = (world->pointLights->super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar8;
      if ((ulong)((long)(world->pointLights->
                        super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3) <= uVar8) {
LAB_001049bc:
        do {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
          uVar10 = uVar8;
        } while( true );
      }
      pPVar4 = ppPVar3[uVar8];
      fVar12 = (pPVar4->position).field_0.field_0.x - (i->intersectionPoint).field_0.field_0.x;
      fVar13 = (pPVar4->position).field_0.field_0.y - (i->intersectionPoint).field_0.field_0.y;
      fVar14 = (pPVar4->position).field_0.field_0.z - (i->intersectionPoint).field_0.field_0.z;
      fVar11 = fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13;
      if (fVar11 < 0.0) {
        local_d0 = (double)CONCAT44(local_d0._4_4_,fVar13);
        local_c4 = fVar14;
        fVar11 = sqrtf(fVar11);
        local_b0.field_0.y = local_d0._0_4_;
        local_b0.field_0.z = local_c4;
      }
      else {
        fVar11 = SQRT(fVar11);
        local_b0.field_0.y = fVar13;
        local_b0.field_0.z = fVar14;
      }
      local_a4.field_0.x = (i->intersectionPoint).field_0.field_0.x;
      local_a4.field_0.y = (i->intersectionPoint).field_0.field_0.y;
      local_a4.field_0.z = (i->intersectionPoint).field_0.field_0.z;
      local_b0.field_0.x = fVar12;
      Ray::Ray((Ray *)&local_60.field_0,(vec3 *)&local_a4.field_0,(vec3 *)&local_b0.field_0,0.1,
               fVar11);
      local_90.field_0.x = local_60.field_0.x;
      local_90._4_8_ = CONCAT44(local_60.field_0.z,local_60.field_0.y);
      uStack_84 = uStack_54;
      local_7c = local_4c;
      uStack_74 = uStack_44;
      uStack_65 = uStack_35;
      if (0 < (int)local_98) {
        uVar10 = 0;
        do {
          ppSVar1 = (world->sceneObjects->
                    super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(world->sceneObjects->
                            super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <=
              uVar10) goto LAB_001049bc;
          pSVar5 = ppSVar1[uVar10];
          iVar7 = (*pSVar5->_vptr_SceneObject[2])(pSVar5,&local_90);
          if (CONCAT44(extraout_var,iVar7) != 0) {
            CVar15 = ColorRGB::operator*(local_c0,0.001);
            fVar13 = CVar15.b;
            fVar11 = CVar15.r;
            fVar12 = CVar15.g;
            goto LAB_00104965;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      local_d0 = (double)((i->surfaceNormal).field_0.field_0.z * (float)local_7c +
                         (i->surfaceNormal).field_0.field_0.x * (float)uStack_84 +
                         (i->surfaceNormal).field_0.field_0.y * uStack_84._4_4_);
      dVar6 = log((double)fVar11 * 0.5);
      fVar11 = 0.0;
      if (0.0 <= (float)(local_d0 / dVar6)) {
        fVar11 = (float)(local_d0 / dVar6);
      }
      CVar15 = ColorRGB::operator*(&pPVar4->color,fVar11);
      local_60.field_0.z = CVar15.b;
      local_60.field_0.x = CVar15.r;
      local_60.field_0.y = CVar15.g;
      CVar15 = ColorRGB::operator+((ColorRGB *)&local_60.field_0,world->ambientColor);
      CVar15 = ColorRGB::operator*(local_c0,CVar15);
      fVar13 = CVar15.b;
      fVar11 = CVar15.r;
      fVar12 = CVar15.g;
LAB_00104965:
      CVar15.g = fVar12;
      CVar15.r = fVar11;
      CVar15.b = fVar13;
      CVar15 = ColorRGB::operator+(&local_e0,CVar15);
      local_e0.b = CVar15.b;
      local_e0._0_8_ = CVar15._0_8_;
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_b8);
  }
  c.b = local_e0.b;
  c.r = local_e0.r;
  c.g = local_e0.g;
  ColorRGB::setColor(&i->color,c);
  return;
}

Assistant:

void Camera::_castShadowRays(Intersection *i, World *world) {
    
    int numObjects = world->sceneObjects->size();
    int numLights = world->pointLights->size();
    glm::vec3 lightDir;
    Ray shadowRay;
    PointLight *pl;
    SceneObject *obj;
    float r, intensity;
    ColorRGB ackColor = ColorRGB();
    bool noHit;
    
    for(int l = 0; l < numLights; ++l) {
        pl = world->pointLights->at(l);
        lightDir = pl->position - i->intersectionPoint;
        r = glm::length(lightDir);
        shadowRay = Ray(i->intersectionPoint, lightDir, 0.1, r);
        noHit = true;
        
        for(int o = 0; o < numObjects; ++o) {
            obj = world->sceneObjects->at(o);
            if( obj->intersects(shadowRay) ) {
                ackColor = ackColor + i->color * 0.001;
                noHit = false; break;
            }
        }

        if(noHit) {
			intensity = glm::dot(i->surfaceNormal, shadowRay.dir) * 1 / std::log(0.5*r);
			if(intensity < 0.0) intensity = 0.0;
			ackColor = ackColor + i->color * (pl->color * intensity + world->ambientColor);
        }
    }
    i->color.setColor(ackColor);
}